

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O2

string * __thiscall
ninx::lexer::token::Variable::dump_abi_cxx11_(string *__return_storage_ptr__,Variable *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"VARIABLE: \'",&this->name);
  std::operator+(__return_storage_ptr__,&local_30,"\'");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::token::Variable::dump() const {
    return "VARIABLE: '" + this->name + "'";
}